

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::MoveCuesBeforeClusters(Segment *this)

{
  int32_t iVar1;
  uint32_t uVar2;
  Segment *this_00;
  uint64_t uVar3;
  SeekHead *this_01;
  long in_RDI;
  int32_t i_2;
  int32_t cues_index;
  int32_t cluster_index;
  int32_t i_1;
  int32_t i;
  uint64_t cue_size;
  uint64_t current_cue_size;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Cues *in_stack_ffffffffffffffb0;
  undefined4 local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  int index;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 local_20;
  int iVar5;
  uint64_t uVar6;
  
  this_00 = (Segment *)Cues::Size(in_stack_ffffffffffffffb0);
  uVar6 = 0;
  iVar5 = 0;
  while( true ) {
    iVar4 = iVar5;
    iVar1 = Cues::cue_entries_size((Cues *)(in_RDI + 8));
    if (iVar1 <= iVar5) break;
    Cues::GetCueByIndex((Cues *)(in_RDI + 8),iVar4);
    uVar3 = CuePoint::Size((CuePoint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                          );
    uVar6 = uVar3 + uVar6;
    iVar5 = iVar4 + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = Cues::cue_entries_size((Cues *)(in_RDI + 8));
    if (iVar1 <= local_20) break;
    MoveCuesBeforeClustersHelper
              (this_00,uVar6,iVar4,
               (uint64_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_20 = local_20 + 1;
  }
  iVar4 = 0;
  iVar5 = 0;
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    uVar2 = SeekHead::GetId((SeekHead *)(in_RDI + 0x20),local_2c);
    if (uVar2 == 0x1f43b675) {
      iVar4 = local_2c;
    }
    uVar2 = SeekHead::GetId((SeekHead *)(in_RDI + 0x20),local_2c);
    if (uVar2 == 0x1c53bb6b) {
      iVar5 = local_2c;
    }
  }
  index = iVar5;
  uVar6 = SeekHead::GetPosition((SeekHead *)(in_RDI + 0x20),iVar4);
  SeekHead::SetSeekEntry((SeekHead *)(in_RDI + 0x20),iVar5,0x1c53bb6b,uVar6);
  this_01 = (SeekHead *)(in_RDI + 0x20);
  uVar6 = Cues::Size((Cues *)this_01);
  uVar3 = SeekHead::GetPosition((SeekHead *)(in_RDI + 0x20),index);
  SeekHead::SetSeekEntry(this_01,iVar4,0x1f43b675,uVar6 + uVar3);
  return;
}

Assistant:

void Segment::MoveCuesBeforeClusters() {
  const uint64_t current_cue_size = cues_.Size();
  uint64_t cue_size = 0;
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    cue_size += cues_.GetCueByIndex(i)->Size();
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    MoveCuesBeforeClustersHelper(current_cue_size, i, &cue_size);

  // Adjust the Seek Entry to reflect the change in position
  // of Cluster and Cues
  int32_t cluster_index = 0;
  int32_t cues_index = 0;
  for (int32_t i = 0; i < SeekHead::kSeekEntryCount; ++i) {
    if (seek_head_.GetId(i) == libwebm::kMkvCluster)
      cluster_index = i;
    if (seek_head_.GetId(i) == libwebm::kMkvCues)
      cues_index = i;
  }
  seek_head_.SetSeekEntry(cues_index, libwebm::kMkvCues,
                          seek_head_.GetPosition(cluster_index));
  seek_head_.SetSeekEntry(cluster_index, libwebm::kMkvCluster,
                          cues_.Size() + seek_head_.GetPosition(cues_index));
}